

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int context_eq(secp256k1_context *a,secp256k1_context *b)

{
  int iVar1;
  secp256k1_ecmult_gen_context *in_RSI;
  long in_RDI;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar2;
  
  bVar2 = false;
  if (*(int *)(in_RDI + 0xe0) == (int)in_RSI[1].scalar_offset.d[3]) {
    iVar1 = ecmult_gen_context_eq
                      (in_RSI,(secp256k1_ecmult_gen_context *)(ulong)in_stack_ffffffffffffffe8);
    bVar2 = false;
    if ((((iVar1 != 0) && (bVar2 = false, *(long *)(in_RDI + 0xc0) == *(long *)(in_RSI + 1))) &&
        (bVar2 = false, *(uint64_t *)(in_RDI + 200) == in_RSI[1].scalar_offset.d[0])) &&
       (bVar2 = false, *(uint64_t *)(in_RDI + 0xd0) == in_RSI[1].scalar_offset.d[1])) {
      bVar2 = *(uint64_t *)(in_RDI + 0xd8) == in_RSI[1].scalar_offset.d[2];
    }
  }
  return (int)bVar2;
}

Assistant:

static int context_eq(const secp256k1_context *a, const secp256k1_context *b) {
    return a->declassify == b->declassify
            && ecmult_gen_context_eq(&a->ecmult_gen_ctx, &b->ecmult_gen_ctx)
            && a->illegal_callback.fn == b->illegal_callback.fn
            && a->illegal_callback.data == b->illegal_callback.data
            && a->error_callback.fn == b->error_callback.fn
            && a->error_callback.data == b->error_callback.data;
}